

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetStyleColorName(ImGuiCol idx)

{
  char *pcStack_10;
  ImGuiCol idx_local;
  
  switch(idx) {
  case 0:
    pcStack_10 = "Text";
    break;
  case 1:
    pcStack_10 = "TextDisabled";
    break;
  case 2:
    pcStack_10 = "WindowBg";
    break;
  case 3:
    pcStack_10 = "ChildBg";
    break;
  case 4:
    pcStack_10 = "PopupBg";
    break;
  case 5:
    pcStack_10 = "Border";
    break;
  case 6:
    pcStack_10 = "BorderShadow";
    break;
  case 7:
    pcStack_10 = "FrameBg";
    break;
  case 8:
    pcStack_10 = "FrameBgHovered";
    break;
  case 9:
    pcStack_10 = "FrameBgActive";
    break;
  case 10:
    pcStack_10 = "TitleBg";
    break;
  case 0xb:
    pcStack_10 = "TitleBgActive";
    break;
  case 0xc:
    pcStack_10 = "TitleBgCollapsed";
    break;
  case 0xd:
    pcStack_10 = "MenuBarBg";
    break;
  case 0xe:
    pcStack_10 = "ScrollbarBg";
    break;
  case 0xf:
    pcStack_10 = "ScrollbarGrab";
    break;
  case 0x10:
    pcStack_10 = "ScrollbarGrabHovered";
    break;
  case 0x11:
    pcStack_10 = "ScrollbarGrabActive";
    break;
  case 0x12:
    pcStack_10 = "CheckMark";
    break;
  case 0x13:
    pcStack_10 = "SliderGrab";
    break;
  case 0x14:
    pcStack_10 = "SliderGrabActive";
    break;
  case 0x15:
    pcStack_10 = "Button";
    break;
  case 0x16:
    pcStack_10 = "ButtonHovered";
    break;
  case 0x17:
    pcStack_10 = "ButtonActive";
    break;
  case 0x18:
    pcStack_10 = "Header";
    break;
  case 0x19:
    pcStack_10 = "HeaderHovered";
    break;
  case 0x1a:
    pcStack_10 = "HeaderActive";
    break;
  case 0x1b:
    pcStack_10 = "Separator";
    break;
  case 0x1c:
    pcStack_10 = "SeparatorHovered";
    break;
  case 0x1d:
    pcStack_10 = "SeparatorActive";
    break;
  case 0x1e:
    pcStack_10 = "ResizeGrip";
    break;
  case 0x1f:
    pcStack_10 = "ResizeGripHovered";
    break;
  case 0x20:
    pcStack_10 = "ResizeGripActive";
    break;
  case 0x21:
    pcStack_10 = "Tab";
    break;
  case 0x22:
    pcStack_10 = "TabHovered";
    break;
  case 0x23:
    pcStack_10 = "TabActive";
    break;
  case 0x24:
    pcStack_10 = "TabUnfocused";
    break;
  case 0x25:
    pcStack_10 = "TabUnfocusedActive";
    break;
  case 0x26:
    pcStack_10 = "DockingPreview";
    break;
  case 0x27:
    pcStack_10 = "DockingEmptyBg";
    break;
  case 0x28:
    pcStack_10 = "PlotLines";
    break;
  case 0x29:
    pcStack_10 = "PlotLinesHovered";
    break;
  case 0x2a:
    pcStack_10 = "PlotHistogram";
    break;
  case 0x2b:
    pcStack_10 = "PlotHistogramHovered";
    break;
  case 0x2c:
    pcStack_10 = "TableHeaderBg";
    break;
  case 0x2d:
    pcStack_10 = "TableBorderStrong";
    break;
  case 0x2e:
    pcStack_10 = "TableBorderLight";
    break;
  case 0x2f:
    pcStack_10 = "TableRowBg";
    break;
  case 0x30:
    pcStack_10 = "TableRowBgAlt";
    break;
  case 0x31:
    pcStack_10 = "TextSelectedBg";
    break;
  case 0x32:
    pcStack_10 = "DragDropTarget";
    break;
  case 0x33:
    pcStack_10 = "NavHighlight";
    break;
  case 0x34:
    pcStack_10 = "NavWindowingHighlight";
    break;
  case 0x35:
    pcStack_10 = "NavWindowingDimBg";
    break;
  case 0x36:
    pcStack_10 = "ModalWindowDimBg";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0xaa4,"const char *ImGui::GetStyleColorName(ImGuiCol)");
  }
  return pcStack_10;
}

Assistant:

const char* ImGui::GetStyleColorName(ImGuiCol idx)
{
    // Create switch-case from enum with regexp: ImGuiCol_{.*}, --> case ImGuiCol_\1: return "\1";
    switch (idx)
    {
    case ImGuiCol_Text: return "Text";
    case ImGuiCol_TextDisabled: return "TextDisabled";
    case ImGuiCol_WindowBg: return "WindowBg";
    case ImGuiCol_ChildBg: return "ChildBg";
    case ImGuiCol_PopupBg: return "PopupBg";
    case ImGuiCol_Border: return "Border";
    case ImGuiCol_BorderShadow: return "BorderShadow";
    case ImGuiCol_FrameBg: return "FrameBg";
    case ImGuiCol_FrameBgHovered: return "FrameBgHovered";
    case ImGuiCol_FrameBgActive: return "FrameBgActive";
    case ImGuiCol_TitleBg: return "TitleBg";
    case ImGuiCol_TitleBgActive: return "TitleBgActive";
    case ImGuiCol_TitleBgCollapsed: return "TitleBgCollapsed";
    case ImGuiCol_MenuBarBg: return "MenuBarBg";
    case ImGuiCol_ScrollbarBg: return "ScrollbarBg";
    case ImGuiCol_ScrollbarGrab: return "ScrollbarGrab";
    case ImGuiCol_ScrollbarGrabHovered: return "ScrollbarGrabHovered";
    case ImGuiCol_ScrollbarGrabActive: return "ScrollbarGrabActive";
    case ImGuiCol_CheckMark: return "CheckMark";
    case ImGuiCol_SliderGrab: return "SliderGrab";
    case ImGuiCol_SliderGrabActive: return "SliderGrabActive";
    case ImGuiCol_Button: return "Button";
    case ImGuiCol_ButtonHovered: return "ButtonHovered";
    case ImGuiCol_ButtonActive: return "ButtonActive";
    case ImGuiCol_Header: return "Header";
    case ImGuiCol_HeaderHovered: return "HeaderHovered";
    case ImGuiCol_HeaderActive: return "HeaderActive";
    case ImGuiCol_Separator: return "Separator";
    case ImGuiCol_SeparatorHovered: return "SeparatorHovered";
    case ImGuiCol_SeparatorActive: return "SeparatorActive";
    case ImGuiCol_ResizeGrip: return "ResizeGrip";
    case ImGuiCol_ResizeGripHovered: return "ResizeGripHovered";
    case ImGuiCol_ResizeGripActive: return "ResizeGripActive";
    case ImGuiCol_Tab: return "Tab";
    case ImGuiCol_TabHovered: return "TabHovered";
    case ImGuiCol_TabActive: return "TabActive";
    case ImGuiCol_TabUnfocused: return "TabUnfocused";
    case ImGuiCol_TabUnfocusedActive: return "TabUnfocusedActive";
    case ImGuiCol_DockingPreview: return "DockingPreview";
    case ImGuiCol_DockingEmptyBg: return "DockingEmptyBg";
    case ImGuiCol_PlotLines: return "PlotLines";
    case ImGuiCol_PlotLinesHovered: return "PlotLinesHovered";
    case ImGuiCol_PlotHistogram: return "PlotHistogram";
    case ImGuiCol_PlotHistogramHovered: return "PlotHistogramHovered";
    case ImGuiCol_TableHeaderBg: return "TableHeaderBg";
    case ImGuiCol_TableBorderStrong: return "TableBorderStrong";
    case ImGuiCol_TableBorderLight: return "TableBorderLight";
    case ImGuiCol_TableRowBg: return "TableRowBg";
    case ImGuiCol_TableRowBgAlt: return "TableRowBgAlt";
    case ImGuiCol_TextSelectedBg: return "TextSelectedBg";
    case ImGuiCol_DragDropTarget: return "DragDropTarget";
    case ImGuiCol_NavHighlight: return "NavHighlight";
    case ImGuiCol_NavWindowingHighlight: return "NavWindowingHighlight";
    case ImGuiCol_NavWindowingDimBg: return "NavWindowingDimBg";
    case ImGuiCol_ModalWindowDimBg: return "ModalWindowDimBg";
    }
    IM_ASSERT(0);
    return "Unknown";
}